

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O3

void __thiscall QXcbScreen::updateGeometry(QXcbScreen *this,xcb_timestamp_t timestamp)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  void *__ptr;
  long in_FS_OFFSET;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x10);
  if ((*(char *)(lVar1 + 0x2b3) == '\x01') && (1 < *(int *)(lVar1 + 0x2d4))) {
    uVar2 = *(undefined8 *)(lVar1 + 0x30);
    uVar3 = xcb_randr_get_crtc_info_unchecked(uVar2,*(undefined4 *)(this + 0x34),timestamp);
    __ptr = (void *)xcb_randr_get_crtc_info_reply(uVar2,uVar3,0);
    if (__ptr != (void *)0x0) {
      local_28.x1.m_i = (int)*(short *)((long)__ptr + 0xc);
      local_28.y1.m_i = (int)*(short *)((long)__ptr + 0xe);
      local_28.x2.m_i = local_28.x1.m_i + -1 + (uint)*(ushort *)((long)__ptr + 0x10);
      local_28.y2.m_i = local_28.y1.m_i + -1 + (uint)*(ushort *)((long)__ptr + 0x12);
      updateGeometry(this,&local_28,*(uint8_t *)((long)__ptr + 0x18));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        free(__ptr);
        return;
      }
      goto LAB_0016cfc6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0016cfc6:
  __stack_chk_fail();
}

Assistant:

void QXcbScreen::updateGeometry(xcb_timestamp_t timestamp)
{
    if (!connection()->isAtLeastXRandR12())
        return;

    auto crtc = Q_XCB_REPLY_UNCHECKED(xcb_randr_get_crtc_info, xcb_connection(),
                                      m_crtc, timestamp);
    if (crtc)
        updateGeometry(QRect(crtc->x, crtc->y, crtc->width, crtc->height), crtc->rotation);
}